

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void LoadMapinfoACSLump(void)

{
  level_info_t *this;
  int lumpnum;
  FName local_14;
  int lump;
  FEDOptions *opt;
  
  this = level.info;
  FName::FName(&local_14,"EData");
  _lump = level_info_t::GetOptData<FEDOptions>(this,&local_14,false);
  if ((_lump != (FEDOptions *)0x0) &&
     (lumpnum = FWadCollection::CheckNumForName(&Wads,&_lump->acsName), -1 < lumpnum)) {
    FBehavior::StaticLoadModule(lumpnum,(FileReader *)0x0,0);
  }
  return;
}

Assistant:

void LoadMapinfoACSLump()
{
	FEDOptions *opt = level.info->GetOptData<FEDOptions>("EData", false);
	if (opt != NULL)
	{
		int lump = Wads.CheckNumForName(opt->acsName);
		if (lump >= 0) FBehavior::StaticLoadModule(lump);
	}
}